

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

void http_sse_unsubscribe(http_sse_s *sse_,uintptr_t subscription)

{
  subscription_s *s;
  subscription_s *sub;
  http_sse_internal_s *sse;
  uintptr_t subscription_local;
  http_sse_s *sse__local;
  
  if ((sse_ != (http_sse_s *)0x0) && (subscription != 0)) {
    s = *(subscription_s **)(subscription + 0x10);
    fio_lock((fio_lock_i *)&sse_[2].on_ready);
    fio_ls_remove((fio_ls_s *)subscription);
    fio_unlock((fio_lock_i *)&sse_[2].on_ready);
    fio_unsubscribe(s);
  }
  return;
}

Assistant:

void http_sse_unsubscribe(http_sse_s *sse_, uintptr_t subscription) {
  if (!sse_ || !subscription)
    return;
  http_sse_internal_s *sse = FIO_LS_EMBD_OBJ(http_sse_internal_s, sse, sse_);
  subscription_s *sub = (subscription_s *)((fio_ls_s *)subscription)->obj;
  fio_lock(&sse->lock);
  fio_ls_remove((fio_ls_s *)subscription);
  fio_unlock(&sse->lock);
  fio_unsubscribe(sub);
}